

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

iterator __thiscall
trompeloeil::list<trompeloeil::call_matcher_base<int_(int,_int)>,_trompeloeil::ignore_disposer>::
push_back(list<trompeloeil::call_matcher_base<int_(int,_int)>,_trompeloeil::ignore_disposer> *this,
         call_matcher_base<int_(int,_int)> *t)

{
  call_matcher_base<int_(int,_int)> *t_local;
  list<trompeloeil::call_matcher_base<int_(int,_int)>,_trompeloeil::ignore_disposer> *this_local;
  
  list_elem<trompeloeil::call_matcher_base<int_(int,_int)>_>::invariant_check
            (&this->super_list_elem<trompeloeil::call_matcher_base<int_(int,_int)>_>);
  (t->super_list_elem<trompeloeil::call_matcher_base<int_(int,_int)>_>).prev =
       (this->super_list_elem<trompeloeil::call_matcher_base<int_(int,_int)>_>).prev;
  (t->super_list_elem<trompeloeil::call_matcher_base<int_(int,_int)>_>).next =
       &this->super_list_elem<trompeloeil::call_matcher_base<int_(int,_int)>_>;
  ((this->super_list_elem<trompeloeil::call_matcher_base<int_(int,_int)>_>).prev)->next =
       &t->super_list_elem<trompeloeil::call_matcher_base<int_(int,_int)>_>;
  (this->super_list_elem<trompeloeil::call_matcher_base<int_(int,_int)>_>).prev =
       &t->super_list_elem<trompeloeil::call_matcher_base<int_(int,_int)>_>;
  list_elem<trompeloeil::call_matcher_base<int_(int,_int)>_>::invariant_check
            (&this->super_list_elem<trompeloeil::call_matcher_base<int_(int,_int)>_>);
  iterator::iterator((iterator *)&this_local,
                     &t->super_list_elem<trompeloeil::call_matcher_base<int_(int,_int)>_>);
  return (iterator)&this_local->super_list_elem<trompeloeil::call_matcher_base<int_(int,_int)>_>;
}

Assistant:

auto
  list<T, Disposer>::push_back(
    T* t)
  noexcept
  -> iterator
  {
    invariant_check();
    t->prev = prev;
    t->next = this;
    prev->next = t;
    prev = t;
    invariant_check();
    return iterator{t};
  }